

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::size
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this)

{
  value_type_conflict2 *__val;
  pointer piVar1;
  uint *puVar2;
  long lVar3;
  
  piVar1 = (pointer)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar1 + 6;
  piVar1[0] = 0;
  piVar1[1] = 0;
  piVar1[2] = 0;
  piVar1[3] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar1 + 6;
  puVar2 = (uint *)((long)&(((this->bitsets_).
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + 0x18);
  lVar3 = 0;
  do {
    piVar1[lVar3] =
         (*(int *)&((_Bit_iterator_base *)(puVar2 + -2))->_M_p - puVar2[-6]) * 8 + *puVar2;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 10;
  } while (lVar3 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::size() const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].size();
    return result;
  }